

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ILogger<std::shared_ptr<spdlog::logger>_> *this;
  IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  AppConfig config_storage;
  Logger<std::shared_ptr<spdlog::logger>_> logger;
  bool local_191;
  shared_ptr<spdlog::logger> local_190;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [16];
  _func_int *local_130 [5];
  undefined1 local_108 [16];
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  Logger<std::shared_ptr<spdlog::logger>_> *local_d8;
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  ILogger<std::shared_ptr<spdlog::logger>_> *local_98;
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  Logger<std::shared_ptr<spdlog::logger>_> local_60;
  
  this = (ILogger<std::shared_ptr<spdlog::logger>_> *)operator_new(0x20);
  local_140._0_8_ = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"ApplicationLog","");
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"Log/log.txt","");
  local_191 = true;
  local_108._0_8_ = local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,local_140._0_8_,local_140._8_8_ + local_140._0_8_);
  spdlog::synchronous_factory::
  create<spdlog::sinks::basic_file_sink<std::mutex>,std::__cxx11::string_const&,bool&>
            ((synchronous_factory *)&local_190,(string *)local_108,&local_160,&local_191);
  if ((undefined1 *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
  }
  LogManager::Concretions::SpdLogger::SpdLogger((SpdLogger *)this,&local_190);
  local_98 = this;
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::Logger(&local_60,&local_98);
  if (local_190.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((_func_int **)local_140._0_8_ != local_130) {
    operator_delete((void *)local_140._0_8_,(ulong)(local_130[0] + 1));
  }
  this_00 = (IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"Config","");
  ConfigManager::Concretions::ReadConfigCfg::ReadConfigCfg((ReadConfigCfg *)this_00,&local_180);
  local_108._8_8_ = local_f8 + 8;
  local_f8._0_8_ = 0;
  local_f8[8] = '\0';
  local_108._0_8_ = &PTR__Reader_0013ac68;
  local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  local_d8 = &local_60;
  ConfigManager::
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ReadConfigurations((map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_90,
                     (Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_108);
  ConfigManager::Configurations::AppConfig::AppConfig
            ((AppConfig *)local_140,
             (map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_90);
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  ConfigManager::
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Reader
            ((Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  ClientFeederApplication::ClientFeederApplication
            ((ClientFeederApplication *)local_108,&local_60,(AppConfig *)local_140);
  iVar1 = ClientFeederApplication::Start((ClientFeederApplication *)local_108);
  local_d8 = (Logger<std::shared_ptr<spdlog::logger>_> *)&PTR__IConfigurationMap_00138ef0;
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_d0);
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::~Logger
            ((Logger<std::shared_ptr<spdlog::logger>_> *)local_108);
  local_140._0_8_ = &PTR__IConfigurationMap_00138ef0;
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_140 + 8));
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::~Logger(&local_60);
  return iVar1;
}

Assistant:

int main()
{
    auto logger = LogManager::Logger(
                std::move(new LogManager::Concretions::SpdLogger(
                              spdlog::basic_logger_mt("ApplicationLog", "Log/log.txt", true))));

    auto config_storage = ConfigManager::Configurations::AppConfig(
                ConfigManager::Reader(std::move(new ConfigManager::Concretions::ReadConfigCfg("Config")),
                                      logger)
                .ReadConfigurations());

    return ClientFeederApplication(logger, config_storage).Start();
}